

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error llvm::createStringError(error_code EC,Twine *S)

{
  Twine *in_RCX;
  error_code EC_00;
  string local_58;
  undefined8 local_38;
  Twine *pTStack_30;
  Twine *S_local;
  error_code EC_local;
  
  EC_00._0_8_ = EC._0_8_;
  S_local._0_4_ = EC._M_cat._0_4_;
  local_38 = CONCAT44(S_local._4_4_,S_local._0_4_);
  pTStack_30 = S;
  EC_local._0_8_ = S;
  EC_local._M_cat = EC_00._0_8_;
  Twine::str_abi_cxx11_(&local_58,in_RCX);
  std::__cxx11::string::c_str();
  EC_00._M_cat._0_4_ = (undefined4)local_38;
  EC_00._M_cat._4_4_ = 0;
  createStringError(EC_00,(char *)pTStack_30);
  std::__cxx11::string::~string((string *)&local_58);
  return (Error)(ErrorInfoBase *)EC_00._0_8_;
}

Assistant:

inline Error createStringError(std::error_code EC, const Twine &S) {
  return createStringError(EC, S.str().c_str());
}